

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

block_state deflate_stored(deflate_state *s,int flush)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  Bytef *pBVar4;
  ulong uVar5;
  
  uVar5 = s->pending_buf_size - 5;
  if (0xfffe < uVar5) {
    uVar5 = 0xffff;
  }
  do {
    if (s->lookahead < 2) {
      fill_window(s);
      if (s->lookahead == 0 && flush == 0) {
        return need_more;
      }
      if (s->lookahead == 0) {
        uVar5 = s->block_start;
        if ((long)uVar5 < 0) {
          pBVar4 = (Bytef *)0x0;
        }
        else {
          pBVar4 = s->window + (uVar5 & 0xffffffff);
        }
        _tr_flush_block(s,(charf *)pBVar4,s->strstart - uVar5,(uint)(flush == 4));
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out != 0) {
          return (uint)(flush == 4) * 2 + block_done;
        }
        return (uint)(flush == 4) * 2;
      }
    }
    uVar3 = s->strstart + s->lookahead;
    s->strstart = uVar3;
    s->lookahead = 0;
    uVar2 = s->block_start;
    uVar1 = uVar2 + uVar5;
    if ((uVar3 == 0) || (uVar1 <= uVar3)) {
      s->lookahead = uVar3 - (uInt)uVar1;
      s->strstart = (uInt)uVar1;
      if ((long)uVar2 < 0) {
        pBVar4 = (Bytef *)0x0;
      }
      else {
        pBVar4 = s->window + (uVar2 & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)pBVar4,(uVar1 & 0xffffffff) - uVar2,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
    uVar1 = s->block_start;
    if (s->w_size - 0x106 <= s->strstart - (int)uVar1) {
      if ((long)uVar1 < 0) {
        pBVar4 = (Bytef *)0x0;
      }
      else {
        pBVar4 = s->window + (uVar1 & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)pBVar4,s->strstart - uVar1,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_stored(deflate_state *s, int flush)
{
    /* Stored blocks are limited to 0xffff bytes, pending_buf is limited
     * to pending_buf_size, and each stored block has a 5 byte header:
     */
    ulg max_block_size = 0xffff;
    ulg max_start;

    if (max_block_size > s->pending_buf_size - 5) {
        max_block_size = s->pending_buf_size - 5;
    }

    /* Copy as much as possible from input to output: */
    for (;;) {
        /* Fill the window as much as possible: */
        if (s->lookahead <= 1) {

            Assert(s->strstart < s->w_size+MAX_DIST(s) ||
                   s->block_start >= (long)s->w_size, "slide too late");

            fill_window(s);
            if (s->lookahead == 0 && flush == Z_NO_FLUSH) return need_more;

            if (s->lookahead == 0) break; /* flush the current block */
        }
        Assert(s->block_start >= 0L, "block gone");

        s->strstart += s->lookahead;
        s->lookahead = 0;

        /* Emit a stored block if pending_buf will be full: */
        max_start = s->block_start + max_block_size;
        if (s->strstart == 0 || (ulg)s->strstart >= max_start) {
            /* strstart == 0 is possible when wraparound on 16-bit machine */
            s->lookahead = (uInt)(s->strstart - max_start);
            s->strstart = (uInt)max_start;
            FLUSH_BLOCK(s, 0);
        }
        /* Flush if we may have to slide, otherwise block_start may become
         * negative and the data will be gone:
         */
        if (s->strstart - (uInt)s->block_start >= MAX_DIST(s)) {
            FLUSH_BLOCK(s, 0);
        }
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}